

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::Base64Test_encodeUrlTest_Test::TestBody
          (Base64Test_encodeUrlTest_Test *this)

{
  size_t sVar1;
  size_type sVar2;
  pointer *__ptr;
  char cVar3;
  char *message;
  AssertionResult gtest_ar;
  string encoded;
  char unicodeText [19];
  Message local_78;
  AssertHelper local_70;
  string local_68;
  string local_48;
  char local_28 [24];
  
  builtin_strncpy(local_28,"Προμηθεύς",0x13);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  sVar1 = strlen(local_28);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_28,local_28 + sVar1);
  detail::base64_encode(&local_48,&local_68);
  if (local_48._M_string_length != 0) {
    sVar2 = 0;
    do {
      cVar3 = local_48._M_dataplus._M_p[sVar2];
      if (cVar3 == '+') {
        cVar3 = '-';
      }
      else if (cVar3 == '/') {
        cVar3 = '_';
      }
      local_48._M_dataplus._M_p[sVar2] = cVar3;
      sVar2 = sVar2 + 1;
    } while (local_48._M_string_length != sVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  testing::internal::CmpHelperEQ<char[25],std::__cxx11::string>
            ((internal *)&local_68,"\"zqDPgc6_zrzOt864zrXPjc-C\"","encoded",
             (char (*) [25])"zqDPgc6_zrzOt864zrXPjc-C",&local_48);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_78);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_78.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if ((undefined8 *)local_68._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_68._M_string_length !=
        (undefined8 *)(local_68._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_68._M_string_length);
    }
    operator_delete((void *)local_68._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Base64Test, encodeUrlTest) {
  const char unicodeText[] =
      "\xce\xa0\xcf\x81\xce\xbf\xce\xbc\xce\xb7\xce\xb8\xce\xb5\xcf\x8d\xcf"
      "\x82";  // Προμηθεύς
  std::string encoded = detail::base64url_encode(unicodeText);
  EXPECT_EQ("zqDPgc6_zrzOt864zrXPjc-C", encoded);
}